

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O0

size_t scp_source_send(ScpServer *s,void *vdata,size_t length)

{
  char cVar1;
  ScpSource *scp_00;
  ulong local_40;
  size_t i;
  char *data;
  ScpSource *scp;
  size_t length_local;
  void *vdata_local;
  ScpServer *s_local;
  
  scp_00 = (ScpSource *)(s + -0x1b);
  if (((ulong)s[-0x1a].vt & 0x100000000000000) == 0) {
    for (local_40 = 0; local_40 < length; local_40 = local_40 + 1) {
      if (((ulong)s[-0x1a].vt & 0x100000000) == 0) {
        cVar1 = *(char *)((long)vdata + local_40);
        if (cVar1 == '\0') {
          *(int *)&s[-0x1a].vt = *(int *)&s[-0x1a].vt + 1;
        }
        else {
          if (cVar1 != '\x01') {
            if (cVar1 != '\x02') {
              scp_source_abort(scp_00,"unrecognised response code from client");
              return 0;
            }
            scp_source_abort(scp_00,"terminating on fatal error from client");
            return 0;
          }
          *(undefined1 *)((long)&s[-0x1a].vt + 4) = 1;
        }
      }
      else if (*(char *)((long)vdata + local_40) == '\n') {
        *(undefined1 *)((long)&s[-0x1a].vt + 4) = 0;
        *(int *)&s[-0x1a].vt = *(int *)&s[-0x1a].vt + 1;
      }
    }
    scp_source_process_stack(scp_00);
  }
  return 0;
}

Assistant:

static size_t scp_source_send(ScpServer *s, const void *vdata, size_t length)
{
    ScpSource *scp = container_of(s, ScpSource, scpserver);
    const char *data = (const char *)vdata;
    size_t i;

    if (scp->finished)
        return 0;

    for (i = 0; i < length; i++) {
        if (scp->expect_newline) {
            if (data[i] == '\012') {
                /* End of an error message following a 1 byte */
                scp->expect_newline = false;
                scp->acks++;
            }
        } else {
            switch (data[i]) {
              case 0:                  /* ordinary ack */
                scp->acks++;
                break;
              case 1:                  /* non-fatal error; consume it */
                scp->expect_newline = true;
                break;
              case 2:
                scp_source_abort(
                    scp, "terminating on fatal error from client");
                return 0;
              default:
                scp_source_abort(
                    scp, "unrecognised response code from client");
                return 0;
            }
        }
    }

    scp_source_process_stack(scp);

    return 0;
}